

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_functor.cpp
# Opt level: O0

void __thiscall
product_functor<float>::product_functor(product_functor<float> *this,float a,float b)

{
  ostream *poVar1;
  string local_38 [32];
  float local_18;
  float local_14;
  float b_local;
  float a_local;
  product_functor<float> *this_local;
  
  this->m_a = a;
  this->m_b = b;
  local_18 = b;
  local_14 = a;
  _b_local = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"Type: ");
  name_of_type<float>();
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,". Computing the product of ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  poVar1 = std::operator<<(poVar1," and ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  std::operator<<(poVar1,".");
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

product_functor(scalar a, scalar b) : m_a(a), m_b(b)
    {
        std::cout << "Type: " << name_of_type<scalar>() << ". Computing the product of " << a << " and " << b << ".";
    }